

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringbuffer.h
# Opt level: O2

void __thiscall
rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
          (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,Ch c)

{
  Ch *pCVar1;
  Ch *pCVar2;
  
  pCVar2 = (this->stack_).stackTop_;
  pCVar1 = (this->stack_).stackEnd_;
  if (pCVar1 == pCVar2 || (long)pCVar1 - (long)pCVar2 < 0) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(&this->stack_,1);
    pCVar2 = (this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = pCVar2 + 1;
  *pCVar2 = c;
  return;
}

Assistant:

void Flush() {}